

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  byte bVar29;
  int iVar30;
  uint uVar31;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  undefined4 uVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  __m128 a;
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  __m128 a_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  uint uVar100;
  uint uVar102;
  uint uVar103;
  uint uVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar101 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2890 [16];
  undefined8 local_2870;
  undefined1 local_2850 [16];
  undefined1 (*local_2838) [16];
  ulong local_2830;
  ulong local_2828;
  ulong local_2820;
  ulong local_2818;
  ulong local_2810;
  ulong local_2808;
  long local_2800;
  long local_27f8;
  ulong local_27f0;
  ulong local_27e8;
  ulong local_27e0;
  ulong local_27d8;
  ulong local_27d0;
  undefined1 (*local_27c8) [16];
  long local_27c0;
  ulong local_27b8;
  RTCFilterFunctionNArguments local_27b0;
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  RTCHitN local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float local_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined1 local_26d0 [16];
  uint local_26c0;
  uint uStack_26bc;
  uint uStack_26b8;
  uint uStack_26b4;
  uint uStack_26b0;
  uint uStack_26ac;
  uint uStack_26a8;
  uint uStack_26a4;
  undefined1 local_26a0 [8];
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2600 [32];
  float local_25e0 [4];
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0 [4];
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined4 local_2420;
  undefined4 uStack_241c;
  undefined4 uStack_2418;
  undefined4 uStack_2414;
  undefined4 uStack_2410;
  undefined4 uStack_240c;
  undefined4 uStack_2408;
  undefined4 uStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar32;
  undefined1 auVar116 [32];
  
  pauVar42 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2480._4_4_ = fVar1;
  local_2480._0_4_ = fVar1;
  local_2480._8_4_ = fVar1;
  local_2480._12_4_ = fVar1;
  local_2480._16_4_ = fVar1;
  local_2480._20_4_ = fVar1;
  local_2480._24_4_ = fVar1;
  local_2480._28_4_ = fVar1;
  auVar93 = ZEXT3264(local_2480);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_24a0._4_4_ = fVar66;
  local_24a0._0_4_ = fVar66;
  local_24a0._8_4_ = fVar66;
  local_24a0._12_4_ = fVar66;
  local_24a0._16_4_ = fVar66;
  local_24a0._20_4_ = fVar66;
  local_24a0._24_4_ = fVar66;
  local_24a0._28_4_ = fVar66;
  auVar94 = ZEXT3264(local_24a0);
  fVar75 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = fVar75;
  local_2400._0_4_ = fVar75;
  local_2400._8_4_ = fVar75;
  local_2400._12_4_ = fVar75;
  local_2400._16_4_ = fVar75;
  local_2400._20_4_ = fVar75;
  local_2400._24_4_ = fVar75;
  local_2400._28_4_ = fVar75;
  auVar101 = ZEXT3264(local_2400);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar66 = fVar66 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar75 = fVar75 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar47 = uVar44 ^ 0x20;
  uVar50 = uVar45 ^ 0x20;
  iVar30 = (tray->tfar).field_0.i[k];
  auVar111 = ZEXT3264(CONCAT428(iVar30,CONCAT424(iVar30,CONCAT420(iVar30,CONCAT416(iVar30,CONCAT412(
                                                  iVar30,CONCAT48(iVar30,CONCAT44(iVar30,iVar30)))))
                                                )));
  uVar41 = uVar46 ^ 0x20;
  local_24c0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_24c0._8_4_ = -fVar1;
  local_24c0._12_4_ = -fVar1;
  local_24c0._16_4_ = -fVar1;
  local_24c0._20_4_ = -fVar1;
  local_24c0._24_4_ = -fVar1;
  local_24c0._28_4_ = -fVar1;
  auVar99 = ZEXT3264(local_24c0);
  local_24e0._0_8_ = CONCAT44(fVar66,fVar66) ^ 0x8000000080000000;
  local_24e0._8_4_ = -fVar66;
  local_24e0._12_4_ = -fVar66;
  local_24e0._16_4_ = -fVar66;
  local_24e0._20_4_ = -fVar66;
  local_24e0._24_4_ = -fVar66;
  local_24e0._28_4_ = -fVar66;
  auVar89 = ZEXT3264(local_24e0);
  local_2420 = 0x80000000;
  uStack_241c = 0x80000000;
  uStack_2418 = 0x80000000;
  uStack_2414 = 0x80000000;
  uStack_2410 = 0x80000000;
  uStack_240c = 0x80000000;
  uStack_2408 = 0x80000000;
  uStack_2404 = 0x80000000;
  local_2440._0_8_ = CONCAT44(fVar75,fVar75) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar75;
  local_2440._12_4_ = -fVar75;
  local_2440._16_4_ = -fVar75;
  local_2440._20_4_ = -fVar75;
  local_2440._24_4_ = -fVar75;
  local_2440._28_4_ = -fVar75;
  auVar119 = ZEXT3264(local_2440);
  iVar30 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar30;
  local_2460._0_4_ = iVar30;
  local_2460._8_4_ = iVar30;
  local_2460._12_4_ = iVar30;
  local_2460._16_4_ = iVar30;
  local_2460._20_4_ = iVar30;
  local_2460._24_4_ = iVar30;
  local_2460._28_4_ = iVar30;
  auVar122 = ZEXT3264(local_2460);
  local_2808 = uVar44 >> 2;
  local_2810 = uVar47 >> 2;
  local_2500._16_16_ = mm_lookupmask_ps._240_16_;
  local_2500._0_16_ = mm_lookupmask_ps._0_16_;
  local_2838 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2818 = uVar45 >> 2;
  local_2820 = uVar50 >> 2;
  local_2828 = uVar46 >> 2;
  local_2830 = uVar41 >> 2;
  auVar88._8_4_ = 0xbf800000;
  auVar88._0_8_ = 0xbf800000bf800000;
  auVar88._12_4_ = 0xbf800000;
  auVar88._16_4_ = 0xbf800000;
  auVar88._20_4_ = 0xbf800000;
  auVar88._24_4_ = 0xbf800000;
  auVar88._28_4_ = 0xbf800000;
  auVar68._8_4_ = 0x3f800000;
  auVar68._0_8_ = 0x3f8000003f800000;
  auVar68._12_4_ = 0x3f800000;
  auVar68._16_4_ = 0x3f800000;
  auVar68._20_4_ = 0x3f800000;
  auVar68._24_4_ = 0x3f800000;
  auVar68._28_4_ = 0x3f800000;
  _local_2520 = vblendvps_avx(auVar68,auVar88,local_2500);
  local_27f0 = uVar50;
  local_27e8 = uVar47;
  local_27e0 = uVar46;
  local_27d8 = uVar45;
  local_27d0 = uVar44;
LAB_0168d6ec:
  do {
    do {
      if (pauVar42 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar34 = pauVar42 + -1;
      pauVar42 = pauVar42 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar34 + 8));
    uVar36 = *(ulong *)*pauVar42;
    while ((uVar36 & 8) == 0) {
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar44),auVar99._0_32_,
                                auVar93._0_32_);
      auVar58 = auVar89._0_32_;
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar45),auVar58,
                                auVar94._0_32_);
      auVar88 = vpmaxsd_avx2(ZEXT1632(auVar52),ZEXT1632(auVar55));
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar46),auVar119._0_32_,
                                auVar101._0_32_);
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar47),auVar99._0_32_,
                                auVar93._0_32_);
      auVar67 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar50),auVar58,
                                auVar94._0_32_);
      auVar57 = vpminsd_avx2(ZEXT1632(auVar55),ZEXT1632(auVar67));
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar41),auVar119._0_32_,
                                auVar101._0_32_);
      auVar68 = vpmaxsd_avx2(ZEXT1632(auVar52),auVar122._0_32_);
      _local_26a0 = vpmaxsd_avx2(auVar88,auVar68);
      auVar88 = vpminsd_avx2(ZEXT1632(auVar55),auVar111._0_32_);
      auVar88 = vpminsd_avx2(auVar57,auVar88);
      auVar88 = vpcmpgtd_avx2(_local_26a0,auVar88);
      iVar30 = vmovmskps_avx(auVar88);
      if (iVar30 == 0xff) goto LAB_0168d6ec;
      bVar29 = ~(byte)iVar30;
      uVar48 = uVar36 & 0xfffffffffffffff0;
      lVar37 = 0;
      for (uVar36 = (ulong)bVar29; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar36 = *(ulong *)(uVar48 + lVar37 * 8);
      uVar31 = bVar29 - 1 & (uint)bVar29;
      uVar32 = (ulong)uVar31;
      if (uVar31 != 0) {
        uVar13 = *(uint *)(local_26a0 + lVar37 * 4);
        lVar37 = 0;
        for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar31 = uVar31 - 1 & uVar31;
        uVar33 = (ulong)uVar31;
        uVar32 = *(ulong *)(uVar48 + lVar37 * 8);
        uVar100 = *(uint *)(local_26a0 + lVar37 * 4);
        if (uVar31 == 0) {
          if (uVar13 < uVar100) {
            *(ulong *)*pauVar42 = uVar32;
            *(uint *)(*pauVar42 + 8) = uVar100;
            pauVar42 = pauVar42 + 1;
          }
          else {
            *(ulong *)*pauVar42 = uVar36;
            *(uint *)(*pauVar42 + 8) = uVar13;
            pauVar42 = pauVar42 + 1;
            uVar36 = uVar32;
          }
        }
        else {
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar36;
          auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar13));
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar32;
          auVar55 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar100));
          lVar37 = 0;
          for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
            lVar37 = lVar37 + 1;
          }
          uVar31 = uVar31 - 1 & uVar31;
          uVar36 = (ulong)uVar31;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(uVar48 + lVar37 * 8);
          auVar53 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_26a0 + lVar37 * 4)));
          auVar67 = vpcmpgtd_avx(auVar55,auVar52);
          if (uVar31 == 0) {
            auVar87 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar55,auVar52,auVar87);
            auVar52 = vblendvps_avx(auVar52,auVar55,auVar87);
            auVar55 = vpcmpgtd_avx(auVar53,auVar67);
            auVar87 = vpshufd_avx(auVar55,0xaa);
            auVar55 = vblendvps_avx(auVar53,auVar67,auVar87);
            auVar67 = vblendvps_avx(auVar67,auVar53,auVar87);
            auVar53 = vpcmpgtd_avx(auVar67,auVar52);
            auVar87 = vpshufd_avx(auVar53,0xaa);
            auVar53 = vblendvps_avx(auVar67,auVar52,auVar87);
            auVar52 = vblendvps_avx(auVar52,auVar67,auVar87);
            *pauVar42 = auVar52;
            pauVar42[1] = auVar53;
            uVar36 = auVar55._0_8_;
            pauVar42 = pauVar42 + 2;
          }
          else {
            lVar37 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar37 = lVar37 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar36 = (ulong)uVar31;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = *(ulong *)(uVar48 + lVar37 * 8);
            auVar87 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_26a0 + lVar37 * 4)));
            if (uVar31 == 0) {
              auVar16 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar55,auVar52,auVar16);
              auVar52 = vblendvps_avx(auVar52,auVar55,auVar16);
              auVar55 = vpcmpgtd_avx(auVar87,auVar53);
              auVar16 = vpshufd_avx(auVar55,0xaa);
              auVar55 = vblendvps_avx(auVar87,auVar53,auVar16);
              auVar53 = vblendvps_avx(auVar53,auVar87,auVar16);
              auVar87 = vpcmpgtd_avx(auVar53,auVar52);
              auVar16 = vpshufd_avx(auVar87,0xaa);
              auVar87 = vblendvps_avx(auVar53,auVar52,auVar16);
              auVar52 = vblendvps_avx(auVar52,auVar53,auVar16);
              auVar53 = vpcmpgtd_avx(auVar55,auVar67);
              auVar16 = vpshufd_avx(auVar53,0xaa);
              auVar53 = vblendvps_avx(auVar55,auVar67,auVar16);
              auVar55 = vblendvps_avx(auVar67,auVar55,auVar16);
              auVar67 = vpcmpgtd_avx(auVar87,auVar55);
              auVar16 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar87,auVar55,auVar16);
              auVar55 = vblendvps_avx(auVar55,auVar87,auVar16);
              *pauVar42 = auVar52;
              pauVar42[1] = auVar55;
              pauVar42[2] = auVar67;
              uVar36 = auVar53._0_8_;
              pauVar34 = pauVar42 + 3;
            }
            else {
              *pauVar42 = auVar52;
              pauVar42[1] = auVar55;
              pauVar42[2] = auVar53;
              pauVar34 = pauVar42 + 3;
              pauVar42[3] = auVar87;
              do {
                lVar37 = 0;
                for (uVar32 = uVar36; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
                {
                  lVar37 = lVar37 + 1;
                }
                auVar53._8_8_ = 0;
                auVar53._0_8_ = *(ulong *)(uVar48 + lVar37 * 8);
                auVar52 = vpunpcklqdq_avx(auVar53,ZEXT416(*(uint *)(local_26a0 + lVar37 * 4)));
                pauVar34[1] = auVar52;
                pauVar34 = pauVar34 + 1;
                uVar36 = uVar36 - 1 & uVar36;
              } while (uVar36 != 0);
              lVar37 = 0;
              while (pauVar34 != pauVar42) {
                auVar52 = pauVar42[1];
                uVar31 = vextractps_avx(auVar52,2);
                for (lVar40 = 0x10;
                    (lVar37 != lVar40 && (*(uint *)(pauVar42[-1] + lVar40 + 8) < uVar31));
                    lVar40 = lVar40 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar42 + lVar40) =
                       *(undefined1 (*) [16])(pauVar42[-1] + lVar40);
                }
                *(undefined1 (*) [16])(*pauVar42 + lVar40) = auVar52;
                lVar37 = lVar37 + -0x10;
                pauVar42 = pauVar42 + 1;
              }
              uVar36 = *(ulong *)*pauVar34;
            }
            auVar89 = ZEXT3264(auVar58);
            pauVar42 = pauVar34;
          }
        }
      }
    }
    local_2800 = (ulong)((uint)uVar36 & 0xf) - 8;
    uVar36 = uVar36 & 0xfffffffffffffff0;
    local_23e0 = auVar111._0_32_;
    local_27c8 = pauVar42;
    for (local_27f8 = 0; local_27f8 != local_2800; local_27f8 = local_27f8 + 1) {
      lVar37 = local_27f8 * 0x90;
      local_27c0 = lVar37 + uVar36;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(uVar36 + 0x40 + lVar37);
      auVar55 = vpmovzxbw_avx(auVar16);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(uVar36 + 0x48 + lVar37);
      auVar52 = vpmovzxbw_avx(auVar4);
      auVar52 = vpminuw_avx(auVar55,auVar52);
      auVar52 = vpcmpeqw_avx(auVar55,auVar52);
      auVar52 = vpacksswb_avx(auVar52,auVar52);
      uVar35 = *(undefined4 *)(uVar36 + 0x70 + lVar37);
      auVar57._4_4_ = uVar35;
      auVar57._0_4_ = uVar35;
      auVar57._8_4_ = uVar35;
      auVar57._12_4_ = uVar35;
      auVar57._16_4_ = uVar35;
      auVar57._20_4_ = uVar35;
      auVar57._24_4_ = uVar35;
      auVar57._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(uVar36 + 0x7c + lVar37);
      auVar69._4_4_ = uVar35;
      auVar69._0_4_ = uVar35;
      auVar69._8_4_ = uVar35;
      auVar69._12_4_ = uVar35;
      auVar69._16_4_ = uVar35;
      auVar69._20_4_ = uVar35;
      auVar69._24_4_ = uVar35;
      auVar69._28_4_ = uVar35;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(local_2808 + 0x40 + local_27c0);
      auVar88 = vpmovzxbd_avx2(auVar5);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar55 = vfmadd213ps_fma(auVar88,auVar69,auVar57);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(local_2810 + 0x40 + local_27c0);
      auVar88 = vpmovzxbd_avx2(auVar6);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar67 = vfmadd213ps_fma(auVar88,auVar69,auVar57);
      uVar35 = *(undefined4 *)(uVar36 + 0x74 + lVar37);
      auVar58._4_4_ = uVar35;
      auVar58._0_4_ = uVar35;
      auVar58._8_4_ = uVar35;
      auVar58._12_4_ = uVar35;
      auVar58._16_4_ = uVar35;
      auVar58._20_4_ = uVar35;
      auVar58._24_4_ = uVar35;
      auVar58._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(uVar36 + 0x80 + lVar37);
      auVar70._4_4_ = uVar35;
      auVar70._0_4_ = uVar35;
      auVar70._8_4_ = uVar35;
      auVar70._12_4_ = uVar35;
      auVar70._16_4_ = uVar35;
      auVar70._20_4_ = uVar35;
      auVar70._24_4_ = uVar35;
      auVar70._28_4_ = uVar35;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(local_2818 + 0x40 + local_27c0);
      auVar88 = vpmovzxbd_avx2(auVar7);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar53 = vfmadd213ps_fma(auVar88,auVar70,auVar58);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(local_2820 + 0x40 + local_27c0);
      auVar88 = vpmovzxbd_avx2(auVar8);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar87 = vfmadd213ps_fma(auVar88,auVar70,auVar58);
      uVar35 = *(undefined4 *)(uVar36 + 0x78 + lVar37);
      auVar59._4_4_ = uVar35;
      auVar59._0_4_ = uVar35;
      auVar59._8_4_ = uVar35;
      auVar59._12_4_ = uVar35;
      auVar59._16_4_ = uVar35;
      auVar59._20_4_ = uVar35;
      auVar59._24_4_ = uVar35;
      auVar59._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(uVar36 + 0x84 + lVar37);
      auVar71._4_4_ = uVar35;
      auVar71._0_4_ = uVar35;
      auVar71._8_4_ = uVar35;
      auVar71._12_4_ = uVar35;
      auVar71._16_4_ = uVar35;
      auVar71._20_4_ = uVar35;
      auVar71._24_4_ = uVar35;
      auVar71._28_4_ = uVar35;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(local_2828 + 0x40 + local_27c0);
      auVar88 = vpmovzxbd_avx2(auVar9);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar16 = vfmadd213ps_fma(auVar88,auVar71,auVar59);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(local_2830 + 0x40 + local_27c0);
      auVar88 = vpmovzxbd_avx2(auVar10);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar4 = vfmadd213ps_fma(auVar88,auVar71,auVar59);
      auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar93._0_32_,auVar99._0_32_);
      auVar53 = vfmadd213ps_fma(ZEXT1632(auVar53),auVar94._0_32_,auVar89._0_32_);
      auVar88 = vpmaxsd_avx2(ZEXT1632(auVar55),ZEXT1632(auVar53));
      auVar55 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar101._0_32_,auVar119._0_32_);
      auVar67 = vfmadd213ps_fma(ZEXT1632(auVar67),auVar93._0_32_,auVar99._0_32_);
      auVar53 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar94._0_32_,auVar89._0_32_);
      auVar57 = vpminsd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar53));
      auVar67 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar101._0_32_,auVar119._0_32_);
      auVar68 = vpmaxsd_avx2(ZEXT1632(auVar55),auVar122._0_32_);
      local_23c0 = vpmaxsd_avx2(auVar88,auVar68);
      auVar88 = vpminsd_avx2(ZEXT1632(auVar67),auVar111._0_32_);
      auVar88 = vpminsd_avx2(auVar57,auVar88);
      auVar88 = vpcmpgtd_avx2(local_23c0,auVar88);
      uVar35 = vmovmskps_avx(auVar88);
      local_27b8 = (ulong)(byte)(~(byte)uVar35 &
                                (SUB161(auVar52 >> 7,0) & 1 | (SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar52 >> 0x3f,0) << 7));
      while (local_27b8 != 0) {
        lVar37 = 0;
        for (uVar48 = local_27b8; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        local_27b8 = local_27b8 - 1 & local_27b8;
        fVar1 = *(float *)(ray + k * 4 + 0x80);
        if (*(float *)(local_23c0 + lVar37 * 4) <= fVar1) {
          uVar11 = *(ushort *)(local_27c0 + lVar37 * 8);
          uVar12 = *(ushort *)(local_27c0 + 2 + lVar37 * 8);
          uVar31 = *(uint *)(local_27c0 + 0x88);
          uVar13 = *(uint *)(local_27c0 + 4 + lVar37 * 8);
          pGVar14 = (context->scene->geometries).items[uVar31].ptr;
          lVar37 = *(long *)&pGVar14->field_0x58;
          lVar43 = pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                   (ulong)uVar13;
          uVar38 = uVar11 & 0x7fff;
          uVar39 = uVar12 & 0x7fff;
          uVar100 = *(uint *)(lVar37 + 4 + lVar43);
          uVar46 = (ulong)uVar100;
          uVar45 = (ulong)(uVar100 * uVar39 + *(int *)(lVar37 + lVar43) + uVar38);
          p_Var15 = pGVar14[1].intersectionFilterN;
          lVar40 = *(long *)&pGVar14[1].time_range.upper;
          auVar52 = *(undefined1 (*) [16])(lVar40 + (uVar45 + 1) * (long)p_Var15);
          auVar55 = *(undefined1 (*) [16])(lVar40 + (uVar45 + uVar46) * (long)p_Var15);
          lVar49 = uVar45 + uVar46 + 1;
          auVar67 = *(undefined1 (*) [16])(lVar40 + lVar49 * (long)p_Var15);
          auVar53 = *(undefined1 (*) [16])
                     (lVar40 + (uVar45 + (-1 < (short)uVar11) + 1) * (long)p_Var15);
          lVar51 = (ulong)(-1 < (short)uVar11) + lVar49;
          auVar87 = *(undefined1 (*) [16])(lVar40 + lVar51 * (long)p_Var15);
          uVar44 = 0;
          if (-1 < (short)uVar12) {
            uVar44 = uVar46;
          }
          auVar16 = *(undefined1 (*) [16])(lVar40 + (uVar45 + uVar46 + uVar44) * (long)p_Var15);
          auVar4 = *(undefined1 (*) [16])(lVar40 + (lVar49 + uVar44) * (long)p_Var15);
          auVar97._16_16_ = *(undefined1 (*) [16])(lVar40 + (uVar44 + lVar51) * (long)p_Var15);
          auVar97._0_16_ = auVar67;
          auVar6 = vunpcklps_avx(auVar52,auVar87);
          auVar5 = vunpckhps_avx(auVar52,auVar87);
          auVar7 = vunpcklps_avx(auVar53,auVar67);
          auVar53 = vunpckhps_avx(auVar53,auVar67);
          auVar8 = vunpcklps_avx(auVar5,auVar53);
          auVar9 = vunpcklps_avx(auVar6,auVar7);
          auVar53 = vunpckhps_avx(auVar6,auVar7);
          auVar6 = vunpcklps_avx(auVar55,auVar4);
          auVar5 = vunpckhps_avx(auVar55,auVar4);
          auVar7 = vunpcklps_avx(auVar67,auVar16);
          auVar16 = vunpckhps_avx(auVar67,auVar16);
          auVar5 = vunpcklps_avx(auVar5,auVar16);
          auVar10 = vunpcklps_avx(auVar6,auVar7);
          auVar16 = vunpckhps_avx(auVar6,auVar7);
          auVar84._16_16_ = auVar4;
          auVar84._0_16_ = auVar55;
          auVar72._16_16_ = auVar87;
          auVar72._0_16_ = auVar52;
          auVar88 = vunpcklps_avx(auVar72,auVar84);
          auVar60._16_16_ = auVar67;
          auVar60._0_16_ = *(undefined1 (*) [16])(lVar40 + (long)p_Var15 * uVar45);
          auVar68 = vunpcklps_avx(auVar60,auVar97);
          auVar70 = vunpcklps_avx(auVar68,auVar88);
          auVar71 = vunpckhps_avx(auVar68,auVar88);
          auVar88 = vunpckhps_avx(auVar72,auVar84);
          auVar68 = vunpckhps_avx(auVar60,auVar97);
          auVar60 = vunpcklps_avx(auVar68,auVar88);
          auVar61._16_16_ = auVar9;
          auVar61._0_16_ = auVar9;
          auVar85._16_16_ = auVar53;
          auVar85._0_16_ = auVar53;
          auVar91._16_16_ = auVar8;
          auVar91._0_16_ = auVar8;
          auVar95._16_16_ = auVar10;
          auVar95._0_16_ = auVar10;
          auVar109._16_16_ = auVar16;
          auVar109._0_16_ = auVar16;
          auVar112._16_16_ = auVar5;
          auVar112._0_16_ = auVar5;
          auVar68 = vsubps_avx(auVar70,auVar61);
          auVar88 = vsubps_avx(auVar71,auVar85);
          auVar57 = vsubps_avx(auVar60,auVar91);
          auVar58 = vsubps_avx(auVar95,auVar70);
          auVar59 = vsubps_avx(auVar109,auVar71);
          auVar69 = vsubps_avx(auVar112,auVar60);
          auVar17._4_4_ = auVar88._4_4_ * auVar69._4_4_;
          auVar17._0_4_ = auVar88._0_4_ * auVar69._0_4_;
          auVar17._8_4_ = auVar88._8_4_ * auVar69._8_4_;
          auVar17._12_4_ = auVar88._12_4_ * auVar69._12_4_;
          auVar17._16_4_ = auVar88._16_4_ * auVar69._16_4_;
          auVar17._20_4_ = auVar88._20_4_ * auVar69._20_4_;
          auVar17._24_4_ = auVar88._24_4_ * auVar69._24_4_;
          auVar17._28_4_ = auVar9._12_4_;
          auVar87 = vfmsub231ps_fma(auVar17,auVar59,auVar57);
          uVar35 = *(undefined4 *)(ray + k * 4);
          auVar115._4_4_ = uVar35;
          auVar115._0_4_ = uVar35;
          auVar115._8_4_ = uVar35;
          auVar115._12_4_ = uVar35;
          auVar115._16_4_ = uVar35;
          auVar115._20_4_ = uVar35;
          auVar115._24_4_ = uVar35;
          auVar115._28_4_ = uVar35;
          uVar35 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar117._4_4_ = uVar35;
          auVar117._0_4_ = uVar35;
          auVar117._8_4_ = uVar35;
          auVar117._12_4_ = uVar35;
          auVar117._16_4_ = uVar35;
          auVar117._20_4_ = uVar35;
          auVar117._24_4_ = uVar35;
          auVar117._28_4_ = uVar35;
          uVar35 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar120._4_4_ = uVar35;
          auVar120._0_4_ = uVar35;
          auVar120._8_4_ = uVar35;
          auVar120._12_4_ = uVar35;
          auVar120._16_4_ = uVar35;
          auVar120._20_4_ = uVar35;
          auVar120._24_4_ = uVar35;
          auVar120._28_4_ = uVar35;
          fVar66 = *(float *)(ray + k * 4 + 0x40);
          auVar110._4_4_ = fVar66;
          auVar110._0_4_ = fVar66;
          auVar110._8_4_ = fVar66;
          auVar110._12_4_ = fVar66;
          auVar110._16_4_ = fVar66;
          auVar110._20_4_ = fVar66;
          auVar110._24_4_ = fVar66;
          auVar110._28_4_ = fVar66;
          auVar18._4_4_ = auVar57._4_4_ * auVar58._4_4_;
          auVar18._0_4_ = auVar57._0_4_ * auVar58._0_4_;
          auVar18._8_4_ = auVar57._8_4_ * auVar58._8_4_;
          auVar18._12_4_ = auVar57._12_4_ * auVar58._12_4_;
          auVar18._16_4_ = auVar57._16_4_ * auVar58._16_4_;
          auVar18._20_4_ = auVar57._20_4_ * auVar58._20_4_;
          auVar18._24_4_ = auVar57._24_4_ * auVar58._24_4_;
          auVar18._28_4_ = auVar53._12_4_;
          auVar70 = vsubps_avx(auVar70,auVar115);
          fVar75 = *(float *)(ray + k * 4 + 0x50);
          auVar114._4_4_ = fVar75;
          auVar114._0_4_ = fVar75;
          auVar114._8_4_ = fVar75;
          auVar114._12_4_ = fVar75;
          auVar116._16_4_ = fVar75;
          auVar116._0_16_ = auVar114;
          auVar116._20_4_ = fVar75;
          auVar116._24_4_ = fVar75;
          auVar116._28_4_ = fVar75;
          auVar53 = vfmsub231ps_fma(auVar18,auVar69,auVar68);
          auVar71 = vsubps_avx(auVar71,auVar117);
          fVar105 = *(float *)(ray + k * 4 + 0x60);
          auVar118._4_4_ = fVar105;
          auVar118._0_4_ = fVar105;
          auVar118._8_4_ = fVar105;
          auVar118._12_4_ = fVar105;
          auVar118._16_4_ = fVar105;
          auVar118._20_4_ = fVar105;
          auVar118._24_4_ = fVar105;
          auVar118._28_4_ = fVar105;
          auVar60 = vsubps_avx(auVar60,auVar120);
          auVar19._4_4_ = fVar66 * auVar71._4_4_;
          auVar19._0_4_ = fVar66 * auVar71._0_4_;
          auVar19._8_4_ = fVar66 * auVar71._8_4_;
          auVar19._12_4_ = fVar66 * auVar71._12_4_;
          auVar19._16_4_ = fVar66 * auVar71._16_4_;
          auVar19._20_4_ = fVar66 * auVar71._20_4_;
          auVar19._24_4_ = fVar66 * auVar71._24_4_;
          auVar19._28_4_ = uVar35;
          auVar52 = vfmsub231ps_fma(auVar19,auVar70,auVar116);
          auVar20._4_4_ = auVar69._4_4_ * auVar52._4_4_;
          auVar20._0_4_ = auVar69._0_4_ * auVar52._0_4_;
          auVar20._8_4_ = auVar69._8_4_ * auVar52._8_4_;
          auVar20._12_4_ = auVar69._12_4_ * auVar52._12_4_;
          auVar20._16_4_ = auVar69._16_4_ * 0.0;
          auVar20._20_4_ = auVar69._20_4_ * 0.0;
          auVar20._24_4_ = auVar69._24_4_ * 0.0;
          auVar20._28_4_ = auVar69._28_4_;
          auVar121._0_4_ = auVar57._0_4_ * auVar52._0_4_;
          auVar121._4_4_ = auVar57._4_4_ * auVar52._4_4_;
          auVar121._8_4_ = auVar57._8_4_ * auVar52._8_4_;
          auVar121._12_4_ = auVar57._12_4_ * auVar52._12_4_;
          auVar121._16_4_ = auVar57._16_4_ * 0.0;
          auVar121._20_4_ = auVar57._20_4_ * 0.0;
          auVar121._24_4_ = auVar57._24_4_ * 0.0;
          auVar121._28_4_ = 0;
          auVar21._4_4_ = fVar105 * auVar70._4_4_;
          auVar21._0_4_ = fVar105 * auVar70._0_4_;
          auVar21._8_4_ = fVar105 * auVar70._8_4_;
          auVar21._12_4_ = fVar105 * auVar70._12_4_;
          auVar21._16_4_ = fVar105 * auVar70._16_4_;
          auVar21._20_4_ = fVar105 * auVar70._20_4_;
          auVar21._24_4_ = fVar105 * auVar70._24_4_;
          auVar21._28_4_ = auVar57._28_4_;
          auVar55 = vfmsub231ps_fma(auVar21,auVar60,auVar110);
          auVar52 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar55),auVar59);
          auVar55 = vfmadd231ps_fma(auVar121,auVar88,ZEXT1632(auVar55));
          auVar22._4_4_ = auVar68._4_4_ * auVar59._4_4_;
          auVar22._0_4_ = auVar68._0_4_ * auVar59._0_4_;
          auVar22._8_4_ = auVar68._8_4_ * auVar59._8_4_;
          auVar22._12_4_ = auVar68._12_4_ * auVar59._12_4_;
          auVar22._16_4_ = auVar68._16_4_ * auVar59._16_4_;
          auVar22._20_4_ = auVar68._20_4_ * auVar59._20_4_;
          auVar22._24_4_ = auVar68._24_4_ * auVar59._24_4_;
          auVar22._28_4_ = auVar59._28_4_;
          auVar67 = vfmsub231ps_fma(auVar22,auVar58,auVar88);
          auVar23._4_4_ = fVar75 * auVar60._4_4_;
          auVar23._0_4_ = fVar75 * auVar60._0_4_;
          auVar23._8_4_ = fVar75 * auVar60._8_4_;
          auVar23._12_4_ = fVar75 * auVar60._12_4_;
          auVar23._16_4_ = fVar75 * auVar60._16_4_;
          auVar23._20_4_ = fVar75 * auVar60._20_4_;
          auVar23._24_4_ = fVar75 * auVar60._24_4_;
          auVar23._28_4_ = auVar88._28_4_;
          auVar16 = vfmsub231ps_fma(auVar23,auVar71,auVar118);
          fVar66 = auVar67._0_4_;
          fVar75 = auVar67._4_4_;
          auVar24._4_4_ = fVar105 * fVar75;
          auVar24._0_4_ = fVar105 * fVar66;
          fVar77 = auVar67._8_4_;
          auVar24._8_4_ = fVar105 * fVar77;
          fVar79 = auVar67._12_4_;
          auVar24._12_4_ = fVar105 * fVar79;
          auVar24._16_4_ = fVar105 * 0.0;
          auVar24._20_4_ = fVar105 * 0.0;
          auVar24._24_4_ = fVar105 * 0.0;
          auVar24._28_4_ = fVar105;
          auVar67 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar53),auVar116);
          auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),ZEXT1632(auVar87),auVar110);
          auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),ZEXT1632(auVar16),auVar58);
          auVar28._4_4_ = uStack_241c;
          auVar28._0_4_ = local_2420;
          auVar28._8_4_ = uStack_2418;
          auVar28._12_4_ = uStack_2414;
          auVar28._16_4_ = uStack_2410;
          auVar28._20_4_ = uStack_240c;
          auVar28._24_4_ = uStack_2408;
          auVar28._28_4_ = uStack_2404;
          auVar88 = vandps_avx(ZEXT1632(auVar67),auVar28);
          uVar100 = auVar88._0_4_;
          auVar96._0_4_ = (float)(uVar100 ^ auVar52._0_4_);
          uVar102 = auVar88._4_4_;
          auVar96._4_4_ = (float)(uVar102 ^ auVar52._4_4_);
          uVar103 = auVar88._8_4_;
          auVar96._8_4_ = (float)(uVar103 ^ auVar52._8_4_);
          uVar104 = auVar88._12_4_;
          auVar96._12_4_ = (float)(uVar104 ^ auVar52._12_4_);
          fVar105 = auVar88._16_4_;
          auVar96._16_4_ = fVar105;
          fVar106 = auVar88._20_4_;
          auVar96._20_4_ = fVar106;
          fVar107 = auVar88._24_4_;
          auVar96._24_4_ = fVar107;
          fVar108 = auVar88._28_4_;
          auVar96._28_4_ = fVar108;
          auVar52 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar68,ZEXT1632(auVar16));
          auVar98._0_4_ = (float)(uVar100 ^ auVar52._0_4_);
          auVar98._4_4_ = (float)(uVar102 ^ auVar52._4_4_);
          auVar98._8_4_ = (float)(uVar103 ^ auVar52._8_4_);
          auVar98._12_4_ = (float)(uVar104 ^ auVar52._12_4_);
          auVar98._16_4_ = fVar105;
          auVar98._20_4_ = fVar106;
          auVar98._24_4_ = fVar107;
          auVar98._28_4_ = fVar108;
          auVar88 = vcmpps_avx(auVar96,ZEXT832(0) << 0x20,5);
          auVar68 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,5);
          auVar88 = vandps_avx(auVar68,auVar88);
          auVar73._8_4_ = 0x7fffffff;
          auVar73._0_8_ = 0x7fffffff7fffffff;
          auVar73._12_4_ = 0x7fffffff;
          auVar73._16_4_ = 0x7fffffff;
          auVar73._20_4_ = 0x7fffffff;
          auVar73._24_4_ = 0x7fffffff;
          auVar73._28_4_ = 0x7fffffff;
          local_2640 = vandps_avx(ZEXT1632(auVar67),auVar73);
          auVar68 = vcmpps_avx(ZEXT1632(auVar67),ZEXT832(0) << 0x20,4);
          auVar88 = vandps_avx(auVar88,auVar68);
          auVar113._0_4_ = auVar96._0_4_ + auVar98._0_4_;
          auVar113._4_4_ = auVar96._4_4_ + auVar98._4_4_;
          auVar113._8_4_ = auVar96._8_4_ + auVar98._8_4_;
          auVar113._12_4_ = auVar96._12_4_ + auVar98._12_4_;
          auVar113._16_4_ = fVar105 + fVar105;
          auVar113._20_4_ = fVar106 + fVar106;
          auVar113._24_4_ = fVar107 + fVar107;
          auVar113._28_4_ = fVar108 + fVar108;
          auVar68 = vcmpps_avx(auVar113,local_2640,2);
          auVar57 = auVar68 & auVar88;
          if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar57 >> 0x7f,0) != '\0') ||
                (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar57 >> 0xbf,0) != '\0') ||
              (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar57[0x1f] < '\0') {
            auVar88 = vandps_avx(auVar88,auVar68);
            auVar52 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar25._4_4_ = fVar75 * auVar60._4_4_;
            auVar25._0_4_ = fVar66 * auVar60._0_4_;
            auVar25._8_4_ = fVar77 * auVar60._8_4_;
            auVar25._12_4_ = fVar79 * auVar60._12_4_;
            auVar25._16_4_ = auVar60._16_4_ * 0.0;
            auVar25._20_4_ = auVar60._20_4_ * 0.0;
            auVar25._24_4_ = auVar60._24_4_ * 0.0;
            auVar25._28_4_ = auVar60._28_4_;
            auVar55 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar53),auVar25);
            auVar55 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar87),ZEXT1632(auVar55));
            local_2660._0_4_ = (float)(uVar100 ^ auVar55._0_4_);
            local_2660._4_4_ = (float)(uVar102 ^ auVar55._4_4_);
            local_2660._8_4_ = (float)(uVar103 ^ auVar55._8_4_);
            local_2660._12_4_ = (float)(uVar104 ^ auVar55._12_4_);
            local_2660._16_4_ = fVar105;
            local_2660._20_4_ = fVar106;
            local_2660._24_4_ = fVar107;
            local_2660._28_4_ = fVar108;
            fVar108 = *(float *)(ray + k * 4 + 0x30);
            fVar65 = local_2640._0_4_;
            fVar74 = local_2640._4_4_;
            auVar26._4_4_ = fVar74 * fVar108;
            auVar26._0_4_ = fVar65 * fVar108;
            fVar76 = local_2640._8_4_;
            auVar26._8_4_ = fVar76 * fVar108;
            fVar78 = local_2640._12_4_;
            auVar26._12_4_ = fVar78 * fVar108;
            fVar80 = local_2640._16_4_;
            auVar26._16_4_ = fVar80 * fVar108;
            fVar81 = local_2640._20_4_;
            auVar26._20_4_ = fVar81 * fVar108;
            fVar82 = local_2640._24_4_;
            auVar26._24_4_ = fVar82 * fVar108;
            auVar26._28_4_ = fVar108;
            auVar88 = vcmpps_avx(auVar26,local_2660,1);
            auVar27._4_4_ = fVar1 * fVar74;
            auVar27._0_4_ = fVar1 * fVar65;
            auVar27._8_4_ = fVar1 * fVar76;
            auVar27._12_4_ = fVar1 * fVar78;
            auVar27._16_4_ = fVar1 * fVar80;
            auVar27._20_4_ = fVar1 * fVar81;
            auVar27._24_4_ = fVar1 * fVar82;
            auVar27._28_4_ = fVar1;
            auVar68 = vcmpps_avx(local_2660,auVar27,2);
            auVar88 = vandps_avx(auVar68,auVar88);
            auVar55 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar52 = vpand_avx(auVar52,auVar55);
            auVar88 = vpmovzxwd_avx2(auVar52);
            auVar88 = vpslld_avx2(auVar88,0x1f);
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar88 >> 0x7f,0) != '\0') ||
                  (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0xbf,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar88[0x1f] < '\0') {
              local_2600 = vpsrad_avx2(auVar88,0x1f);
              auVar68 = vsubps_avx(local_2640,auVar98);
              auVar68 = vblendvps_avx(auVar96,auVar68,local_2500);
              auVar57 = vsubps_avx(local_2640,auVar96);
              local_2680 = vblendvps_avx(auVar98,auVar57,local_2500);
              local_2580._0_4_ = (float)local_2520._0_4_ * auVar87._0_4_;
              local_2580._4_4_ = (float)local_2520._4_4_ * auVar87._4_4_;
              local_2580._8_4_ = fStack_2518 * auVar87._8_4_;
              local_2580._12_4_ = fStack_2514 * auVar87._12_4_;
              local_2580._16_4_ = fStack_2510 * 0.0;
              local_2580._20_4_ = fStack_250c * 0.0;
              local_2580._24_4_ = fStack_2508 * 0.0;
              local_2580._28_4_ = 0;
              local_2560._4_4_ = (float)local_2520._4_4_ * auVar53._4_4_;
              local_2560._0_4_ = (float)local_2520._0_4_ * auVar53._0_4_;
              local_2560._8_4_ = fStack_2518 * auVar53._8_4_;
              local_2560._12_4_ = fStack_2514 * auVar53._12_4_;
              local_2560._16_4_ = fStack_2510 * 0.0;
              local_2560._20_4_ = fStack_250c * 0.0;
              local_2560._24_4_ = fStack_2508 * 0.0;
              local_2560._28_4_ = 0;
              local_2540._4_4_ = (float)local_2520._4_4_ * fVar75;
              local_2540._0_4_ = (float)local_2520._0_4_ * fVar66;
              local_2540._8_4_ = fStack_2518 * fVar77;
              local_2540._12_4_ = fStack_2514 * fVar79;
              local_2540._16_4_ = fStack_2510 * 0.0;
              local_2540._20_4_ = fStack_250c * 0.0;
              local_2540._24_4_ = fStack_2508 * 0.0;
              local_2540._28_4_ = 0;
              auVar83._0_4_ = (float)(int)(*(ushort *)(lVar37 + 8 + lVar43) - 1);
              auVar83._4_12_ = auVar114._4_12_;
              auVar62._0_8_ = (ulong)CONCAT24(uVar11,(uint)uVar11) & 0x7fff00007fff;
              auVar62._8_4_ = uVar38;
              auVar62._12_4_ = uVar38;
              auVar62._16_4_ = uVar38;
              auVar62._20_4_ = uVar38;
              auVar62._24_4_ = uVar38;
              auVar62._28_4_ = uVar38;
              auVar57 = vpaddd_avx2(auVar62,_DAT_01fb7740);
              auVar52 = vrcpss_avx(auVar83,auVar83);
              auVar55 = vfnmadd213ss_fma(auVar52,auVar83,ZEXT416(0x40000000));
              fStack_2688 = auVar55._0_4_ * auVar52._0_4_;
              auVar57 = vcvtdq2ps_avx(auVar57);
              fStack_2684 = auVar68._28_4_ + auVar57._28_4_;
              local_26a0._0_4_ = (auVar68._0_4_ + fVar65 * auVar57._0_4_) * fStack_2688;
              local_26a0._4_4_ = (auVar68._4_4_ + fVar74 * auVar57._4_4_) * fStack_2688;
              fStack_2698 = (auVar68._8_4_ + fVar76 * auVar57._8_4_) * fStack_2688;
              fStack_2694 = (auVar68._12_4_ + fVar78 * auVar57._12_4_) * fStack_2688;
              fStack_2690 = (auVar68._16_4_ + fVar80 * auVar57._16_4_) * fStack_2688;
              fStack_268c = (auVar68._20_4_ + fVar81 * auVar57._20_4_) * fStack_2688;
              fStack_2688 = (auVar68._24_4_ + fVar82 * auVar57._24_4_) * fStack_2688;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar86._0_8_ = (ulong)CONCAT24(uVar12,(uint)uVar12) & 0x7fff00007fff;
                auVar86._8_4_ = uVar39;
                auVar86._12_4_ = uVar39;
                auVar86._16_4_ = uVar39;
                auVar86._20_4_ = uVar39;
                auVar86._24_4_ = uVar39;
                auVar86._28_4_ = uVar39;
                auVar68 = vpaddd_avx2(auVar86,_DAT_01fb7760);
                auVar68 = vcvtdq2ps_avx(auVar68);
                auVar90._0_4_ = (float)(int)(*(ushort *)(lVar37 + 10 + lVar43) - 1);
                auVar90._4_12_ = auVar114._4_12_;
                auVar52 = vrcpss_avx(auVar90,auVar90);
                auVar55 = vfnmadd213ss_fma(auVar52,auVar90,ZEXT416(0x40000000));
                fVar1 = auVar55._0_4_ * auVar52._0_4_;
                auVar57 = vrcpps_avx(local_2640);
                auVar92._8_4_ = 0x3f800000;
                auVar92._0_8_ = 0x3f8000003f800000;
                auVar92._12_4_ = 0x3f800000;
                auVar92._16_4_ = 0x3f800000;
                auVar92._20_4_ = 0x3f800000;
                auVar92._24_4_ = 0x3f800000;
                auVar92._28_4_ = 0x3f800000;
                auVar52 = vfnmadd213ps_fma(local_2640,auVar57,auVar92);
                auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar57,auVar57);
                fVar66 = auVar52._0_4_;
                fVar75 = auVar52._4_4_;
                local_2780._4_4_ = fVar75 * local_2660._4_4_;
                local_2780._0_4_ = fVar66 * local_2660._0_4_;
                fVar77 = auVar52._8_4_;
                local_2780._8_4_ = fVar77 * local_2660._8_4_;
                fVar79 = auVar52._12_4_;
                local_2780._12_4_ = fVar79 * local_2660._12_4_;
                local_2780._16_4_ = fVar105 * 0.0;
                local_2780._20_4_ = fVar106 * 0.0;
                local_2780._24_4_ = fVar107 * 0.0;
                local_2780._28_4_ = 0x3f800000;
                auVar89 = ZEXT3264(local_2780);
                local_25a0 = local_2780;
                local_25e0[0] = (float)local_26a0._0_4_ * fVar66;
                local_25e0[1] = (float)local_26a0._4_4_ * fVar75;
                local_25e0[2] = fStack_2698 * fVar77;
                local_25e0[3] = fStack_2694 * fVar79;
                fStack_25d0 = fStack_2690 * 0.0;
                fStack_25cc = fStack_268c * 0.0;
                fStack_25c8 = fStack_2688 * 0.0;
                fStack_25c4 = fStack_2684;
                local_25c0[0] = (fVar65 * auVar68._0_4_ + local_2680._0_4_) * fVar1 * fVar66;
                local_25c0[1] = (fVar74 * auVar68._4_4_ + local_2680._4_4_) * fVar1 * fVar75;
                local_25c0[2] = (fVar76 * auVar68._8_4_ + local_2680._8_4_) * fVar1 * fVar77;
                local_25c0[3] = (fVar78 * auVar68._12_4_ + local_2680._12_4_) * fVar1 * fVar79;
                fStack_25b0 = (fVar80 * auVar68._16_4_ + local_2680._16_4_) * fVar1 * 0.0;
                fStack_25ac = (fVar81 * auVar68._20_4_ + local_2680._20_4_) * fVar1 * 0.0;
                fStack_25a8 = (fVar82 * auVar68._24_4_ + local_2680._24_4_) * fVar1 * 0.0;
                fStack_25a4 = fStack_2684;
                auVar63._8_4_ = 0x7f800000;
                auVar63._0_8_ = 0x7f8000007f800000;
                auVar63._12_4_ = 0x7f800000;
                auVar63._16_4_ = 0x7f800000;
                auVar63._20_4_ = 0x7f800000;
                auVar63._24_4_ = 0x7f800000;
                auVar63._28_4_ = 0x7f800000;
                auVar68 = vblendvps_avx(auVar63,local_2780,auVar88);
                auVar57 = vshufps_avx(auVar68,auVar68,0xb1);
                auVar57 = vminps_avx(auVar68,auVar57);
                auVar58 = vshufpd_avx(auVar57,auVar57,5);
                auVar57 = vminps_avx(auVar57,auVar58);
                auVar58 = vpermpd_avx2(auVar57,0x4e);
                auVar57 = vminps_avx(auVar57,auVar58);
                auVar57 = vcmpps_avx(auVar68,auVar57,0);
                auVar58 = local_2600 & auVar57;
                auVar68 = local_2600;
                if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar58 >> 0x7f,0) != '\0') ||
                      (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar58 >> 0xbf,0) != '\0') ||
                    (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar58[0x1f] < '\0') {
                  auVar68 = vandps_avx(auVar57,local_2600);
                }
                auVar52 = vpcmpeqd_avx(auVar88._0_16_,auVar88._0_16_);
                auVar93 = ZEXT1664(auVar52);
                uVar38 = vmovmskps_avx(auVar68);
                uVar100 = 0;
                for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                  uVar100 = uVar100 + 1;
                }
                uVar44 = (ulong)uVar100;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar1 = local_25e0[uVar44];
                  fVar66 = local_25c0[uVar44];
                  uVar35 = *(undefined4 *)(local_2580 + uVar44 * 4);
                  uVar2 = *(undefined4 *)(local_2560 + uVar44 * 4);
                  uVar3 = *(undefined4 *)(local_2540 + uVar44 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar44 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar35;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar3;
                  *(float *)(ray + k * 4 + 0xf0) = fVar1;
                  *(float *)(ray + k * 4 + 0x100) = fVar66;
                  *(uint *)(ray + k * 4 + 0x110) = uVar13;
                  *(uint *)(ray + k * 4 + 0x120) = uVar31;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_2870 = CONCAT44(uVar13,uVar13);
                  auVar52 = *local_2838;
                  local_2890 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  local_2760 = local_2600;
                  while( true ) {
                    local_2700 = local_25e0[uVar44];
                    local_26f0 = local_25c0[uVar44];
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar44 * 4);
                    local_27b0.context = context->user;
                    uVar35 = *(undefined4 *)(local_2580 + uVar44 * 4);
                    uVar2 = *(undefined4 *)(local_2560 + uVar44 * 4);
                    local_2720._4_4_ = uVar2;
                    local_2720._0_4_ = uVar2;
                    local_2720._8_4_ = uVar2;
                    local_2720._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_2540 + uVar44 * 4);
                    local_2710._4_4_ = uVar2;
                    local_2710._0_4_ = uVar2;
                    local_2710._8_4_ = uVar2;
                    local_2710._12_4_ = uVar2;
                    local_2730[0] = (RTCHitN)(char)uVar35;
                    local_2730[1] = (RTCHitN)(char)((uint)uVar35 >> 8);
                    local_2730[2] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
                    local_2730[3] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
                    local_2730[4] = (RTCHitN)(char)uVar35;
                    local_2730[5] = (RTCHitN)(char)((uint)uVar35 >> 8);
                    local_2730[6] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
                    local_2730[7] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
                    local_2730[8] = (RTCHitN)(char)uVar35;
                    local_2730[9] = (RTCHitN)(char)((uint)uVar35 >> 8);
                    local_2730[10] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
                    local_2730[0xb] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
                    local_2730[0xc] = (RTCHitN)(char)uVar35;
                    local_2730[0xd] = (RTCHitN)(char)((uint)uVar35 >> 8);
                    local_2730[0xe] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
                    local_2730[0xf] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
                    fStack_26fc = local_2700;
                    fStack_26f8 = local_2700;
                    fStack_26f4 = local_2700;
                    fStack_26ec = local_26f0;
                    fStack_26e8 = local_26f0;
                    fStack_26e4 = local_26f0;
                    local_26e0 = local_2870;
                    uStack_26d8 = CONCAT44(uVar13,uVar13);
                    local_26d0._4_4_ = uVar31;
                    local_26d0._0_4_ = uVar31;
                    local_26d0._8_4_ = uVar31;
                    local_26d0._12_4_ = uVar31;
                    vpcmpeqd_avx2(ZEXT1632(local_26d0),ZEXT1632(local_26d0));
                    uStack_26bc = (local_27b0.context)->instID[0];
                    local_26c0 = uStack_26bc;
                    uStack_26b8 = uStack_26bc;
                    uStack_26b4 = uStack_26bc;
                    uStack_26b0 = (local_27b0.context)->instPrimID[0];
                    uStack_26ac = uStack_26b0;
                    uStack_26a8 = uStack_26b0;
                    uStack_26a4 = uStack_26b0;
                    local_27b0.valid = (int *)local_2850;
                    local_27b0.geometryUserPtr = pGVar14->userPtr;
                    local_27b0.hit = local_2730;
                    local_27b0.N = 4;
                    local_2850 = auVar52;
                    local_27b0.ray = (RTCRayN *)ray;
                    if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar55 = auVar93._0_16_;
                      (*pGVar14->intersectionFilterN)(&local_27b0);
                      auVar89 = ZEXT3264(local_2780);
                      auVar55 = vpcmpeqd_avx(auVar55,auVar55);
                      auVar93 = ZEXT1664(auVar55);
                    }
                    auVar55 = auVar93._0_16_;
                    if (local_2850 == (undefined1  [16])0x0) {
                      auVar67 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar67 = auVar67 ^ auVar55;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_27b0);
                        auVar89 = ZEXT3264(local_2780);
                        auVar55 = vpcmpeqd_avx(auVar55,auVar55);
                        auVar93 = ZEXT1664(auVar55);
                      }
                      auVar55 = vpcmpeqd_avx(local_2850,_DAT_01f45a50);
                      auVar67 = auVar55 ^ auVar93._0_16_;
                      if (local_2850 != (undefined1  [16])0x0) {
                        auVar55 = auVar55 ^ auVar93._0_16_;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])local_27b0.hit);
                        *(undefined1 (*) [16])(local_27b0.ray + 0xc0) = auVar53;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x10));
                        *(undefined1 (*) [16])(local_27b0.ray + 0xd0) = auVar53;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x20));
                        *(undefined1 (*) [16])(local_27b0.ray + 0xe0) = auVar53;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x30));
                        *(undefined1 (*) [16])(local_27b0.ray + 0xf0) = auVar53;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x40));
                        *(undefined1 (*) [16])(local_27b0.ray + 0x100) = auVar53;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x50));
                        *(undefined1 (*) [16])(local_27b0.ray + 0x110) = auVar53;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x60));
                        *(undefined1 (*) [16])(local_27b0.ray + 0x120) = auVar53;
                        auVar53 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x70));
                        *(undefined1 (*) [16])(local_27b0.ray + 0x130) = auVar53;
                        auVar55 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])
                                                          (local_27b0.hit + 0x80));
                        *(undefined1 (*) [16])(local_27b0.ray + 0x140) = auVar55;
                      }
                    }
                    auVar56._8_8_ = 0x100000001;
                    auVar56._0_8_ = 0x100000001;
                    if ((auVar56 & auVar67) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_2890._0_4_;
                    }
                    else {
                      local_2890._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_2890._4_4_ = 0;
                      local_2890._8_4_ = 0;
                      local_2890._12_4_ = 0;
                    }
                    *(undefined4 *)(local_2760 + uVar44 * 4) = 0;
                    auVar54._4_4_ = local_2890._0_4_;
                    auVar54._0_4_ = local_2890._0_4_;
                    auVar54._8_4_ = local_2890._0_4_;
                    auVar54._12_4_ = local_2890._0_4_;
                    auVar54._16_4_ = local_2890._0_4_;
                    auVar54._20_4_ = local_2890._0_4_;
                    auVar54._24_4_ = local_2890._0_4_;
                    auVar54._28_4_ = local_2890._0_4_;
                    auVar68 = vcmpps_avx(auVar89._0_32_,auVar54,2);
                    auVar88 = vandps_avx(auVar68,local_2760);
                    local_2760 = local_2760 & auVar68;
                    if ((((((((local_2760 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_2760 >> 0x3f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0) &&
                            (local_2760 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && SUB321(local_2760 >> 0x7f,0) == '\0') &&
                          (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_2760 >> 0xbf,0) == '\0') &&
                        (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_2760[0x1f]) break;
                    auVar64._8_4_ = 0x7f800000;
                    auVar64._0_8_ = 0x7f8000007f800000;
                    auVar64._12_4_ = 0x7f800000;
                    auVar64._16_4_ = 0x7f800000;
                    auVar64._20_4_ = 0x7f800000;
                    auVar64._24_4_ = 0x7f800000;
                    auVar64._28_4_ = 0x7f800000;
                    auVar68 = vblendvps_avx(auVar64,auVar89._0_32_,auVar88);
                    auVar57 = vshufps_avx(auVar68,auVar68,0xb1);
                    auVar57 = vminps_avx(auVar68,auVar57);
                    auVar58 = vshufpd_avx(auVar57,auVar57,5);
                    auVar57 = vminps_avx(auVar57,auVar58);
                    auVar58 = vpermpd_avx2(auVar57,0x4e);
                    auVar57 = vminps_avx(auVar57,auVar58);
                    auVar57 = vcmpps_avx(auVar68,auVar57,0);
                    auVar58 = auVar88 & auVar57;
                    auVar68 = auVar88;
                    if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar58 >> 0x7f,0) != '\0') ||
                          (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar58 >> 0xbf,0) != '\0') ||
                        (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar58[0x1f] < '\0') {
                      auVar68 = vandps_avx(auVar57,auVar88);
                    }
                    uVar38 = vmovmskps_avx(auVar68);
                    uVar100 = 0;
                    for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                      uVar100 = uVar100 + 1;
                    }
                    uVar44 = (ulong)uVar100;
                    local_2760 = auVar88;
                  }
                }
              }
            }
          }
          auVar101 = ZEXT3264(local_2400);
          auVar111 = ZEXT3264(local_23e0);
          auVar119 = ZEXT3264(local_2440);
          auVar122 = ZEXT3264(local_2460);
          uVar44 = local_27d0;
          uVar45 = local_27d8;
          uVar46 = local_27e0;
          uVar47 = local_27e8;
          pauVar42 = local_27c8;
          uVar50 = local_27f0;
        }
      }
      auVar93 = ZEXT3264(local_2480);
      auVar94 = ZEXT3264(local_24a0);
      auVar99 = ZEXT3264(local_24c0);
      auVar89 = ZEXT3264(local_24e0);
    }
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar111 = ZEXT3264(CONCAT428(uVar35,CONCAT424(uVar35,CONCAT420(uVar35,CONCAT416(uVar35,
                                                  CONCAT412(uVar35,CONCAT48(uVar35,CONCAT44(uVar35,
                                                  uVar35))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }